

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

bool __thiscall leveldb::Version::UpdateStats(Version *this,GetStats *stats)

{
  FileMetaData *pFVar1;
  FileMetaData *f;
  GetStats *stats_local;
  Version *this_local;
  bool local_1;
  
  pFVar1 = stats->seek_file;
  if (((pFVar1 == (FileMetaData *)0x0) ||
      (pFVar1->allowed_seeks = pFVar1->allowed_seeks + -1, 0 < pFVar1->allowed_seeks)) ||
     (this->file_to_compact_ != (FileMetaData *)0x0)) {
    local_1 = false;
  }
  else {
    this->file_to_compact_ = pFVar1;
    this->file_to_compact_level_ = stats->seek_file_level;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Version::UpdateStats(const GetStats& stats) {
  FileMetaData* f = stats.seek_file;
  if (f != nullptr) {
    f->allowed_seeks--;
    if (f->allowed_seeks <= 0 && file_to_compact_ == nullptr) {
      file_to_compact_ = f;
      file_to_compact_level_ = stats.seek_file_level;
      return true;
    }
  }
  return false;
}